

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_zecho(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  char *in_RSI;
  long in_RDI;
  DESCRIPTOR_DATA *d;
  char buffer [9216];
  undefined4 in_stack_ffffffffffffdbd8;
  int in_stack_ffffffffffffdbdc;
  DESCRIPTOR_DATA *local_2420;
  CHAR_DATA *in_stack_ffffffffffffdbe8;
  CHAR_DATA *in_stack_ffffffffffffdbf0;
  char *in_stack_ffffffffffffdbf8;
  char *in_stack_ffffffffffffdc00;
  
  if (*in_RSI == '\0') {
    send_to_char((char *)in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
  }
  else {
    for (local_2420 = descriptor_list; local_2420 != (DESCRIPTOR_DATA *)0x0;
        local_2420 = local_2420->next) {
      if ((((local_2420->connected == 0) &&
           (local_2420->character->in_room != (ROOM_INDEX_DATA *)0x0)) &&
          (*(long *)(in_RDI + 0xa8) != 0)) &&
         (local_2420->character->in_room->area ==
          *(AREA_DATA_conflict **)(*(long *)(in_RDI + 0xa8) + 0x30))) {
        colorconv(in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
        in_stack_ffffffffffffdbdc =
             get_trust((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8));
        iVar2 = get_trust((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8)
                         );
        if (iVar2 <= in_stack_ffffffffffffdbdc) {
          bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8))
          ;
          if (!bVar1) {
            send_to_char((char *)in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
          }
        }
        send_to_char((char *)in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
        send_to_char((char *)in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
      }
    }
  }
  return;
}

Assistant:

void do_zecho(CHAR_DATA *ch, char *argument)
{
	char buffer[MAX_STRING_LENGTH * 2];
	DESCRIPTOR_DATA *d;

	if (argument[0] == '\0')
	{
		send_to_char("Zone echo what?\n\r", ch);
		return;
	}

	for (d = descriptor_list; d; d = d->next)
	{
		if (d->connected == CON_PLAYING
			&& d->character->in_room != nullptr
			&& ch->in_room != nullptr
			&& d->character->in_room->area == ch->in_room->area)
		{
			colorconv(buffer, argument, d->character);

			if (get_trust(d->character) >= get_trust(ch) && !is_npc(ch))
				send_to_char("zone> ", d->character);

			send_to_char(buffer, d->character);
			send_to_char("\n\r", d->character);
		}
	}
}